

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O2

void __thiscall agg::bspline::prepare(bspline *this)

{
  double *pdVar1;
  uint num;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  pod_array<double> al;
  
  iVar5 = this->m_num;
  if (2 < (long)iVar5) {
    pdVar1 = (this->m_am).m_array;
    for (lVar3 = 0; iVar5 != lVar3; lVar3 = lVar3 + 1) {
      pdVar1[lVar3] = 0.0;
    }
    num = iVar5 * 3;
    al.m_array = pod_allocator<double>::allocate(num);
    for (uVar2 = 0; num != uVar2; uVar2 = uVar2 + 1) {
      al.m_array[uVar2] = 0.0;
    }
    iVar5 = this->m_num;
    lVar4 = (long)iVar5;
    lVar7 = (long)(iVar5 * 2);
    uVar2 = lVar4 - 1;
    pdVar1 = this->m_x;
    pdVar8 = this->m_y;
    dVar12 = pdVar1[1] - *pdVar1;
    dVar10 = (pdVar8[1] - *pdVar8) / (pdVar1[1] - *pdVar1);
    for (lVar3 = 1; lVar3 < (long)uVar2; lVar3 = lVar3 + 1) {
      dVar11 = pdVar1[lVar3 + 1] - pdVar1[lVar3];
      dVar13 = (pdVar8[lVar3 + 1] - pdVar8[lVar3]) / dVar11;
      dVar14 = dVar11 / (dVar12 + dVar11);
      al.m_array[lVar3] = dVar14;
      al.m_array[lVar4 + lVar3] = 1.0 - dVar14;
      al.m_array[lVar7 + lVar3] = ((dVar13 - dVar10) * 6.0) / (dVar12 + dVar11);
      dVar12 = dVar11;
      dVar10 = dVar13;
    }
    pdVar1 = al.m_array;
    for (lVar3 = 1; pdVar8 = pdVar1 + 1, lVar3 < (long)uVar2; lVar3 = lVar3 + 1) {
      dVar12 = 1.0 / (pdVar8[lVar4] * *pdVar1 + 2.0);
      *pdVar8 = -dVar12 * *pdVar8;
      pdVar8[lVar7] = (pdVar8[lVar7] - pdVar8[lVar4] * pdVar1[lVar7]) * dVar12;
      pdVar1 = pdVar8;
    }
    pdVar1 = (this->m_am).m_array;
    pdVar1[uVar2 & 0xffffffff] = 0.0;
    dVar12 = al.m_array[lVar7 + lVar4 + -2];
    uVar9 = lVar4 - 2;
    al.m_array[uVar9 & 0xffffffff] = dVar12;
    pdVar1[uVar9 & 0xffffffff] = dVar12;
    uVar2 = (ulong)(iVar5 + -3);
    uVar6 = 0;
    if (0 < (int)uVar9) {
      uVar6 = uVar9 & 0xffffffff;
    }
    while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
      uVar9 = uVar2 & 0xffffffff;
      dVar12 = al.m_array[uVar9] * al.m_array[(int)uVar2 + 1] + al.m_array[lVar7 + uVar2];
      al.m_array[uVar9] = dVar12;
      pdVar1[uVar9] = dVar12;
      uVar2 = uVar2 - 1;
    }
    al.m_size = num;
    pod_array<double>::~pod_array(&al);
  }
  this->m_last_idx = -1;
  return;
}

Assistant:

void bspline::prepare()
    {
        if(m_num > 2)
        {
            int i, k, n1;
            double* temp; 
            double* r; 
            double* s;
            double h, p, d, f, e;
    
            for(k = 0; k < m_num; k++) 
            {
                m_am[k] = 0.0;
            }

            n1 = 3 * m_num;

            pod_array<double> al(n1);
            temp = &al[0];

            for(k = 0; k < n1; k++) 
            {
                temp[k] = 0.0;
            }

            r = temp + m_num;
            s = temp + m_num * 2;

            n1 = m_num - 1;
            d = m_x[1] - m_x[0];
            e = (m_y[1] - m_y[0]) / d;

            for(k = 1; k < n1; k++) 
            {
                h     = d;
                d     = m_x[k + 1] - m_x[k];
                f     = e;
                e     = (m_y[k + 1] - m_y[k]) / d;
                al[k] = d / (d + h);
                r[k]  = 1.0 - al[k];
                s[k]  = 6.0 * (e - f) / (h + d);
            }

            for(k = 1; k < n1; k++) 
            {
                p = 1.0 / (r[k] * al[k - 1] + 2.0);
                al[k] *= -p;
                s[k] = (s[k] - r[k] * s[k - 1]) * p; 
            }

            m_am[n1]     = 0.0;
            al[n1 - 1]   = s[n1 - 1];
            m_am[n1 - 1] = al[n1 - 1];

            for(k = n1 - 2, i = 0; i < m_num - 2; i++, k--) 
            {
                al[k]   = al[k] * al[k + 1] + s[k];
                m_am[k] = al[k];
            }
        }
        m_last_idx = -1;
    }